

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

void __thiscall cmStateSnapshot::SetDirectoryDefinitions(cmStateSnapshot *this)

{
  PositionType *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  string *psVar4;
  PointerType pSVar5;
  PointerType pcVar6;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_SOURCE_DIR","");
  psVar4 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  sVar3 = psVar4->_M_string_length;
  this_00 = &this->Position;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar5->Vars);
  value._M_str = pcVar2;
  value._M_len = sVar3;
  cmDefinitions::Set(pcVar6,&local_48,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_CURRENT_SOURCE_DIR","")
  ;
  psVar4 = cmState::GetSourceDirectory_abi_cxx11_(this->State);
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  sVar3 = psVar4->_M_string_length;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar5->Vars);
  value_00._M_str = pcVar2;
  value_00._M_len = sVar3;
  cmDefinitions::Set(pcVar6,&local_48,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_BINARY_DIR","");
  psVar4 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  sVar3 = psVar4->_M_string_length;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar5->Vars);
  value_01._M_str = pcVar2;
  value_01._M_len = sVar3;
  cmDefinitions::Set(pcVar6,&local_48,value_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"CMAKE_CURRENT_BINARY_DIR","")
  ;
  psVar4 = cmState::GetBinaryDirectory_abi_cxx11_(this->State);
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  sVar3 = psVar4->_M_string_length;
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar6 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar5->Vars);
  value_02._M_str = pcVar2;
  value_02._M_len = sVar3;
  cmDefinitions::Set(pcVar6,&local_48,value_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmStateSnapshot::SetDirectoryDefinitions()
{
  this->SetDefinition("CMAKE_SOURCE_DIR", this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_CURRENT_SOURCE_DIR",
                      this->State->GetSourceDirectory());
  this->SetDefinition("CMAKE_BINARY_DIR", this->State->GetBinaryDirectory());
  this->SetDefinition("CMAKE_CURRENT_BINARY_DIR",
                      this->State->GetBinaryDirectory());
}